

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

void embree::printCommandLine(int argc,char **argv)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  bool bVar4;
  
  if (0 < argc) {
    uVar3 = 0;
    do {
      pcVar2 = argv[uVar3];
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2f77d0);
      }
      else {
        sVar1 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar1);
      }
      bVar4 = uVar3 < argc - 1;
      pcVar2 = "";
      if (bVar4) {
        pcVar2 = " ";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,(ulong)bVar4);
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
    if (0 < argc) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      return;
    }
  }
  return;
}

Assistant:

void printCommandLine(int argc, char** argv)
{
  for (int i = 0; i < argc; ++i)
      std::cout << argv[i] << (i < argc-1 ? " " : "");
  if (argc > 0) std::cout <<  std::endl;
}